

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O3

Var Js::RegexHelper::RegexEs5MatchImpl<false>
              (ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
              JavascriptString *input,bool noResult,void *stackAllocationPointer)

{
  int iVar1;
  RegexPattern *this;
  TrigramAlphabet *this_00;
  char *pcVar2;
  RecyclableObject *nonMatchValue;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  uint16 uVar6;
  charcount_t inputLength;
  char16 *input_00;
  GroupInfo GVar7;
  GroupInfo GVar8;
  undefined4 *puVar9;
  Matcher *pMVar10;
  JavascriptArray *pJVar11;
  SparseArraySegmentBase *pSVar12;
  JavascriptString *pJVar13;
  charcount_t length;
  int k;
  char *pcVar14;
  charcount_t start;
  uint32 offset;
  uint uVar15;
  CharCount inputLength_00;
  void *pvVar16;
  Type *addr;
  Type offset_00;
  ulong uVar17;
  int k_1;
  Type *addr_00;
  long lVar18;
  ulong uVar19;
  undefined1 local_98 [8];
  RegexMatchState state;
  ulong local_58;
  ulong local_50;
  
  this = (regularExpression->pattern).ptr;
  pvVar16 = stackAllocationPointer;
  input_00 = JavascriptString::GetString(input);
  inputLength_00 = (CharCount)pvVar16;
  inputLength = JavascriptString::GetLength(input);
  RegexHelperTrace(scriptContext,Match,regularExpression,input);
  this_00 = scriptContext->trigramAlphabet;
  pcVar2 = *(char **)((long)&this->rep + 0x10);
  if ((249999 < inputLength && this_00 != (TrigramAlphabet *)0x0) && pcVar2 != (char *)0x0) {
    if (this_00->input == (char16 *)0x0) {
      UnifiedRegex::TrigramAlphabet::MegaMatch(this_00,input_00,inputLength);
    }
    if (*pcVar2 == '\x01') {
      iVar1 = *(int *)(pcVar2 + 0xc);
      if (iVar1 < 1) {
        uVar17 = 0xffffffff00000000;
        uVar19 = 0;
      }
      else {
        uVar19 = (ulong)*(uint *)(pcVar2 + (ulong)(iVar1 - 1) * 4 + 0x10);
        uVar17 = 0x800000000;
      }
      if ((this->rep).unified.program.ptr == (Program *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x1dc,"(pattern->rep.unified.program != 0)",
                                    "pattern->rep.unified.program != 0");
        if (!bVar5) goto LAB_00d41529;
        *puVar9 = 0;
      }
      lVar18 = *(long *)((long)&this->rep + 8);
      if (lVar18 == 0) {
        pcVar14 = (char *)((long)&this->rep + 8);
        pMVar10 = UnifiedRegex::Matcher::New(scriptContext,this);
        Memory::Recycler::WBSetBit(pcVar14);
        (this->rep).unified.matcher.ptr = pMVar10;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar14);
        lVar18 = *(long *)((long)&this->rep + 8);
      }
      if (*(short *)(*(long *)(lVar18 + 0x10) + 0xc) == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/RegexRuntime.h"
                                    ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                                    "groupId >= 0 && groupId < program->numGroups");
        if (!bVar5) goto LAB_00d41529;
        *puVar9 = 0;
      }
      **(ulong **)(lVar18 + 0x18) = uVar17 | uVar19;
      bVar5 = UnifiedRegex::RegexPattern::IsGlobal(this);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x1e1,"(pattern->IsGlobal())","pattern->IsGlobal()");
        if (!bVar5) {
LAB_00d41529:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar9 = 0;
      }
      UnifiedRegex::RegexPattern::NumGroups(this);
      pJVar11 = JavascriptLibrary::CreateArrayOnStack
                          ((scriptContext->super_ScriptContextBase).javascriptLibrary,
                           stackAllocationPointer);
      if (0 < *(int *)(pcVar2 + 0xc)) {
        if (pcVar2[1] == '\0') {
          pcVar14 = pcVar2 + 0x90;
          uVar17 = 0;
          do {
            pJVar13 = SubString::New(input,*(charcount_t *)(pcVar2 + uVar17 * 4 + 0x10),8);
            Memory::Recycler::WBSetBit(pcVar14);
            *(JavascriptString **)pcVar14 = pJVar13;
            Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar14);
            pSVar12 = JavascriptArray::GetLastUsedSegment(pJVar11);
            if ((uVar17 < pSVar12->left) ||
               (uVar15 = (uint32)uVar17 - pSVar12->left, pSVar12->size <= uVar15)) {
              JavascriptArray::DirectSetItem_Full<Js::JavascriptString*>
                        (pJVar11,(uint32)uVar17,pJVar13);
            }
            else {
              JavascriptArray::DirectSetItemInLastUsedSegmentAt<Js::JavascriptString*>
                        (pJVar11,uVar15,pJVar13);
            }
            uVar17 = uVar17 + 1;
            pcVar14 = pcVar14 + 8;
          } while ((long)uVar17 < (long)*(int *)(pcVar2 + 0xc));
          pcVar2[1] = '\x01';
        }
        else {
          uVar17 = 0;
          do {
            pJVar13 = *(JavascriptString **)(pcVar2 + uVar17 * 8 + 0x90);
            pSVar12 = JavascriptArray::GetLastUsedSegment(pJVar11);
            if ((uVar17 < pSVar12->left) ||
               (uVar15 = (uint32)uVar17 - pSVar12->left, pSVar12->size <= uVar15)) {
              JavascriptArray::DirectSetItem_Full<Js::JavascriptString*>
                        (pJVar11,(uint32)uVar17,pJVar13);
            }
            else {
              JavascriptArray::DirectSetItemInLastUsedSegmentAt<Js::JavascriptString*>
                        (pJVar11,uVar15,pJVar13);
            }
            uVar17 = uVar17 + 1;
          } while ((long)uVar17 < (long)*(int *)(pcVar2 + 0xc));
        }
      }
      if (0 < iVar1) {
        return pJVar11;
      }
      goto LAB_00d4150c;
    }
  }
  local_50 = 0xffffffff00000000;
  bVar5 = UnifiedRegex::RegexPattern::IsGlobal(this);
  bVar4 = UnifiedRegex::RegexPattern::IsSticky(this);
  if ((bVar5) || (!bVar4)) {
    offset_00 = 0;
    PrimBeginMatch((RegexMatchState *)local_98,scriptContext,this,input_00,inputLength_00,false);
LAB_00d40f10:
    state.matcher = (Matcher *)__tls_get_addr(&PTR_01548f08);
    GVar8 = PrimMatch((RegexMatchState *)local_98,scriptContext,this,inputLength,offset_00);
    local_58 = 0;
    pJVar11 = (JavascriptArray *)0x0;
    if ((ulong)GVar8 >> 0x20 != 0xffffffff) {
      pJVar11 = (JavascriptArray *)0x0;
      uVar17 = (ulong)GVar8 >> 0x20;
      do {
        local_50 = uVar17;
        GVar7 = GVar8;
        start = GVar7.offset;
        length = (charcount_t)local_50;
        if (!noResult) {
          uVar15 = (uint)local_58;
          if (pJVar11 == (JavascriptArray *)0x0) {
            uVar6 = UnifiedRegex::RegexPattern::NumGroups(this);
            if (bVar5) {
              pJVar11 = JavascriptLibrary::CreateArrayOnStack
                                  ((scriptContext->super_ScriptContextBase).javascriptLibrary,
                                   stackAllocationPointer);
              pJVar13 = SubString::New(input,start,length);
              goto LAB_00d40fcd;
            }
            pJVar11 = JavascriptRegularExpressionResult::Create
                                (stackAllocationPointer,(uint)uVar6,input,scriptContext);
            pJVar13 = SubString::New(input,start,length);
LAB_00d41083:
            pSVar12 = (pJVar11->head).ptr;
            if (pSVar12->length <= uVar15) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              pMVar10 = state.matcher;
              *(undefined4 *)&((state.matcher)->pattern).ptr = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                          ,0x22f,"(globalIndex < arrayResult->GetHead()->length)",
                                          "globalIndex < arrayResult->GetHead()->length");
              if (!bVar4) goto LAB_00d41529;
              *(undefined4 *)&(pMVar10->pattern).ptr = 0;
              pSVar12 = (pJVar11->head).ptr;
            }
            addr = &pSVar12[1].left + local_58 * 2;
            Memory::Recycler::WBSetBit((char *)addr);
            *(JavascriptString **)addr = pJVar13;
            Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
          }
          else {
            pJVar13 = SubString::New(input,start,length);
            if (!bVar5) goto LAB_00d41083;
LAB_00d40fcd:
            if (uVar15 == 0xffffffff) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              pMVar10 = state.matcher;
              *(undefined4 *)&((state.matcher)->pattern).ptr = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.inl"
                                          ,0x1d5,"(itemIndex < InvalidIndex)",
                                          "itemIndex < InvalidIndex");
              if (!bVar4) goto LAB_00d41529;
              *(undefined4 *)&(pMVar10->pattern).ptr = 0;
            }
            pSVar12 = JavascriptArray::GetLastUsedSegment(pJVar11);
            offset = uVar15 - pSVar12->left;
            if ((uVar15 < pSVar12->left) || (pSVar12->size <= offset)) {
              JavascriptArray::DirectSetItem_Full<Js::JavascriptString*>(pJVar11,uVar15,pJVar13);
            }
            else {
              JavascriptArray::DirectSetItemInLastUsedSegmentAt<Js::JavascriptString*>
                        (pJVar11,offset,pJVar13);
            }
          }
          local_58 = (ulong)(uVar15 + 1);
        }
        if ((!bVar5) || (uVar15 = start + length + (uint)(length == 0), inputLength < uVar15))
        break;
        GVar8 = PrimMatch((RegexMatchState *)local_98,scriptContext,this,inputLength,uVar15);
        uVar17 = (ulong)GVar8 >> 0x20;
      } while ((ulong)GVar8 >> 0x20 != 0xffffffff);
      local_50 = local_50 << 0x20;
      local_58 = (ulong)GVar7 & 0xffffffff;
    }
  }
  else {
    offset_00 = regularExpression->lastIndexOrFlag;
    if (offset_00 == 0xfffffffe) {
      JavascriptRegExp::CacheLastIndex(regularExpression);
      offset_00 = regularExpression->lastIndexOrFlag;
    }
    local_58 = 0;
    PrimBeginMatch((RegexMatchState *)local_98,scriptContext,this,input_00,inputLength_00,false);
    if (offset_00 <= inputLength) goto LAB_00d40f10;
    pJVar11 = (JavascriptArray *)0x0;
  }
  if (state.input != (char16 *)0x0) {
    ScriptContext::ReleaseTemporaryAllocator(scriptContext,(TempArenaAllocatorObject *)state.input);
  }
  if (pJVar11 != (JavascriptArray *)0x0) {
    uVar6 = UnifiedRegex::RegexPattern::NumGroups(this);
    if (bVar5) {
      return pJVar11;
    }
    if (1 < uVar6) {
      nonMatchValue =
           (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
      pSVar12 = (pJVar11->head).ptr;
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      addr_00 = (Type *)&pSVar12[1].size;
      uVar17 = 1;
      do {
        pSVar12 = (pJVar11->head).ptr;
        if (pSVar12->length + pSVar12->left <= uVar17) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                      ,0x24b,
                                      "(groupId < arrayResult->GetHead()->left + arrayResult->GetHead()->length)"
                                      ,
                                      "groupId < arrayResult->GetHead()->left + arrayResult->GetHead()->length"
                                     );
          if (!bVar5) goto LAB_00d41529;
          *puVar9 = 0;
        }
        GVar8 = UnifiedRegex::RegexPattern::GetGroup(this,(int)uVar17);
        pSVar12 = (SparseArraySegmentBase *)GetString(scriptContext,input,nonMatchValue,GVar8);
        Memory::Recycler::WBSetBit((char *)addr_00);
        addr_00->ptr = pSVar12;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
        uVar17 = uVar17 + 1;
        addr_00 = addr_00 + 1;
      } while (uVar6 != uVar17);
    }
    JavascriptRegularExpressionResult::SetMatch(pJVar11,(GroupInfo)(local_50 | local_58));
    return pJVar11;
  }
LAB_00d4150c:
  return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase)
         .nullValue.ptr;
}

Assistant:

Var RegexHelper::RegexEs5MatchImpl(ScriptContext* scriptContext, JavascriptRegExp *regularExpression, JavascriptString *input, bool noResult, void *const stackAllocationPointer)
    {
        UnifiedRegex::RegexPattern* pattern = regularExpression->GetPattern();
        const char16* inputStr = input->GetString();
        CharCount inputLength = input->GetLength();

#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Match, regularExpression, input);
#endif

        UnifiedRegex::GroupInfo lastSuccessfulMatch; // initially undefined
        UnifiedRegex::GroupInfo lastActualMatch; // initially undefined

#ifdef REGEX_TRIGRAMS
        UnifiedRegex::TrigramAlphabet* trigramAlphabet = scriptContext->GetTrigramAlphabet();
        UnifiedRegex::TrigramInfo* trigramInfo = pattern->rep.unified.trigramInfo;
        if (trigramAlphabet != NULL && inputLength >= MinTrigramInputLength && trigramInfo != NULL)
        {
            if (trigramAlphabet->input == NULL)
            {
                trigramAlphabet->MegaMatch((char16*)inputStr, inputLength);
            }
            if (trigramInfo->isTrigramPattern)
            {
                if (trigramInfo->resultCount > 0)
                {
                    lastSuccessfulMatch.offset = trigramInfo->offsets[trigramInfo->resultCount - 1];
                    lastSuccessfulMatch.length = UnifiedRegex::TrigramInfo::PatternLength;
                }
                // else: leave lastMatch undefined

                // Make sure a matcher is allocated and holds valid last match in case the RegExp constructor
                // needs to fill-in details from the last match via JavascriptRegExpConstructor::EnsureValues
                Assert(pattern->rep.unified.program != 0);
                if (pattern->rep.unified.matcher == 0)
                    pattern->rep.unified.matcher = UnifiedRegex::Matcher::New(scriptContext, pattern);
                *pattern->rep.unified.matcher->GroupIdToGroupInfo(0) = lastSuccessfulMatch;

                Assert(pattern->IsGlobal());

                JavascriptArray* arrayResult = CreateMatchResult(stackAllocationPointer, scriptContext, /* isGlobal */ true, pattern->NumGroups(), input);
                FinalizeMatchResult(scriptContext, /* isGlobal */ true, arrayResult, lastSuccessfulMatch);

                if (trigramInfo->resultCount > 0)
                {
                    if (trigramInfo->hasCachedResultString)
                    {
                        for (int k = 0; k < trigramInfo->resultCount; k++)
                        {
                            arrayResult->DirectSetItemAt(k,
                                static_cast<Js::JavascriptString*>(trigramInfo->cachedResult[k]));
                        }
                    }
                    else
                    {
                        for (int k = 0; k < trigramInfo->resultCount; k++)
                        {
                            JavascriptString * str = SubString::New(input, trigramInfo->offsets[k], UnifiedRegex::TrigramInfo::PatternLength);
                            trigramInfo->cachedResult[k] = str;
                            arrayResult->DirectSetItemAt(k, str);
                        }
                        trigramInfo->hasCachedResultString = true;
                    }
                } // otherwise, there are no results and null will be returned

                if (updateHistory)
                {
                    PropagateLastMatch(scriptContext, /* isGlobal */ true, pattern->IsSticky(), regularExpression, input, lastSuccessfulMatch, lastActualMatch, true, true);
                }

                return lastSuccessfulMatch.IsUndefined() ? scriptContext->GetLibrary()->GetNull() : arrayResult;
            }
        }
#endif

        // If global regex, result array holds substrings for each match, and group bindings are ignored
        // If non-global regex, result array holds overall substring and each group binding substring

        const bool isGlobal = pattern->IsGlobal();
        const bool isSticky = pattern->IsSticky();
        JavascriptArray* arrayResult = 0;
        RegexMatchState state;

        // If global = false and sticky = true, set offset = lastIndex, else set offset = 0
        CharCount offset = 0;
        if (!isGlobal && isSticky)
        {
            offset = regularExpression->GetLastIndex();
        }

        uint32 globalIndex = 0;
        PrimBeginMatch(state, scriptContext, pattern, inputStr, inputLength, false);

        do
        {
            if (offset > inputLength)
            {
                lastActualMatch.Reset();
                break;
            }
            lastActualMatch = PrimMatch(state, scriptContext, pattern, inputLength, offset);

            if (lastActualMatch.IsUndefined())
                break;
            lastSuccessfulMatch = lastActualMatch;
            if (!noResult)
            {
                if (arrayResult == 0)
                    arrayResult = CreateMatchResult(stackAllocationPointer, scriptContext, isGlobal, pattern->NumGroups(), input);
                JavascriptString *const matchedString = SubString::New(input, lastActualMatch.offset, lastActualMatch.length);
                if (isGlobal)
                    arrayResult->DirectSetItemAt(globalIndex, matchedString);
                else
                {
                    // The array's head segment up to length - 1 may not be filled. Write to the head segment element directly
                    // instead of calling a helper that expects the segment to be pre-filled.
                    Assert(globalIndex < arrayResult->GetHead()->length);
                    static_cast<SparseArraySegment<Var> *>(arrayResult->GetHead())->elements[globalIndex] = matchedString;
                }
                globalIndex++;
            }
            offset = lastActualMatch.offset + max(lastActualMatch.length, static_cast<CharCountOrFlag>(1));
        } while (isGlobal);
        PrimEndMatch(state, scriptContext, pattern);
        if (updateHistory)
        {
            PropagateLastMatch(scriptContext, isGlobal, isSticky, regularExpression, input, lastSuccessfulMatch, lastActualMatch, true, true);
        }

        if (arrayResult == 0)
        {
            return scriptContext->GetLibrary()->GetNull();
        }

        const int numGroups = pattern->NumGroups();
        if (!isGlobal)
        {
            if (numGroups > 1)
            {
                // Overall match already captured in index 0 by above, so just grab the groups
                Var nonMatchValue = NonMatchValue(scriptContext, false);
                Field(Var) *elements = ((SparseArraySegment<Var>*)arrayResult->GetHead())->elements;
                for (uint groupId = 1; groupId < (uint)numGroups; groupId++)
                {
                    Assert(groupId < arrayResult->GetHead()->left + arrayResult->GetHead()->length);
                    elements[groupId] = GetGroup(scriptContext, pattern, input, nonMatchValue, groupId);
                }
            }
            FinalizeMatchResult(scriptContext, /* isGlobal */ false, arrayResult, lastSuccessfulMatch);
        }
        else
        {
            FinalizeMatchResult(scriptContext, /* isGlobal */ true, arrayResult, lastSuccessfulMatch);
        }

        return arrayResult;
    }